

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void __thiscall
PythonModuleClient::recv_event(PythonModuleClient *this,string *origin,string *event,TrodesMsg *msg)

{
  bool_type bVar1;
  override recv_event;
  PyLockGIL lock;
  undefined1 auStack_78 [12];
  PyLockGIL local_6c;
  handle<_object> local_68;
  string local_60 [32];
  string local_40 [32];
  
  local_6c.gstate = PyGILState_Ensure();
  boost::python::wrapper<AbstractModuleClient>::get_override
            ((wrapper<AbstractModuleClient> *)auStack_78,
             (char *)&this->super_wrapper<AbstractModuleClient>);
  bVar1 = boost::python::api::object_operators::operator_cast_to_function_pointer
                    ((object_operators *)auStack_78);
  if (bVar1 == 0) {
    boost::python::api::object_base::~object_base((object_base *)auStack_78);
    std::__cxx11::string::string(local_60,(string *)origin);
    std::__cxx11::string::string(local_40,(string *)event);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
  }
  else {
    boost::python::override::operator()
              ((override *)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
               origin,(TrodesMsg *)event);
    boost::python::handle<_object>::~handle(&local_68);
    boost::python::api::object_base::~object_base((object_base *)auStack_78);
  }
  PyLockGIL::~PyLockGIL(&local_6c);
  return;
}

Assistant:

void recv_event(std::string origin, std::string event, TrodesMsg &msg){
        PyLockGIL lock;
        if(override recv_event = this->get_override("recv_event")){
            try{
                recv_event(origin, event, msg);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_event in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_event(origin, event, msg);
    }